

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_359b51::BuildEngineImpl::processRuleScanRequest
          (BuildEngineImpl *this,RuleScanRequest request)

{
  BuildEngineDelegate *pBVar1;
  undefined1 auVar2 [24];
  undefined1 auVar3 [20];
  RuleInfo *ruleInfo_00;
  bool bVar4;
  pointer pBVar5;
  pointer pRVar6;
  pointer pRVar7;
  RuleScanRecord *pRVar8;
  pointer inputTask;
  TaskInfo *pTVar9;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  KeyIDAndFlags KVar13;
  byte local_53;
  bool isAvailable;
  bool isScanned;
  RuleInfo *inputRuleInfo;
  KeyID local_40;
  undefined2 local_38;
  ValueTy local_30;
  undefined2 local_28;
  ValueTy *local_20;
  KeyIDAndFlags *keyAndFlag;
  RuleInfo *ruleInfo;
  BuildEngineImpl *this_local;
  
  keyAndFlag = (KeyIDAndFlags *)request.ruleInfo;
  ruleInfo = (RuleInfo *)this;
  bVar4 = RuleInfo::isScanning(request.ruleInfo);
  local_53 = 1;
  if (!bVar4) {
    local_53 = keyAndFlag[8].field_0xc;
  }
  if ((local_53 & 1) == 0) {
    __assert_fail("ruleInfo.isScanning() || ruleInfo.wasForced",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x261,
                  "void (anonymous namespace)::BuildEngineImpl::processRuleScanRequest(RuleScanRequest)"
                 );
  }
  bVar4 = RuleInfo::isScanning((RuleInfo *)keyAndFlag);
  if (bVar4) {
    do {
      if (request.inputRuleInfo == (RuleInfo *)0x0) {
        KVar13 = llbuild::core::DependencyKeyIDs::operator[]
                           ((DependencyKeyIDs *)&keyAndFlag[4].orderOnly,(ulong)request.inputIndex);
        local_40 = KVar13.keyID._value;
        local_30 = local_40._value;
        local_38 = KVar13._8_2_;
        local_28 = local_38;
        local_20 = &local_30;
        getRuleInfoForKey(this,local_40);
      }
      ruleInfo_00 = request.inputRuleInfo;
      bVar4 = scanRule(this,request.inputRuleInfo);
      if (!bVar4) {
        bVar4 = RuleInfo::isScanning(ruleInfo_00);
        if (bVar4) {
          bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
          if (bVar4) {
            pBVar5 = std::
                     unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                     ::operator->(&this->trace);
            pRVar6 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                     ::get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                            *)&keyAndFlag->orderOnly);
            pRVar7 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                     ::get(&ruleInfo_00->rule);
            llbuild::core::BuildEngineTrace::ruleScanningDeferredOnInput(pBVar5,pRVar6,pRVar7);
          }
          pRVar8 = RuleInfo::getPendingScanRecord(ruleInfo_00);
          std::
          vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ::push_back(&pRVar8->deferredScanRequests,&request);
          return;
        }
        __assert_fail("inputRuleInfo.isScanning()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x276,
                      "void (anonymous namespace)::BuildEngineImpl::processRuleScanRequest(RuleScanRequest)"
                     );
      }
      bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
      if (bVar4) {
        pBVar5 = std::
                 unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                 ::operator->(&this->trace);
        pRVar6 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)
                     &keyAndFlag->orderOnly);
        pRVar7 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 get(&ruleInfo_00->rule);
        llbuild::core::BuildEngineTrace::ruleScanningNextInput(pBVar5,pRVar6,pRVar7);
      }
      bVar4 = demandRule(this,ruleInfo_00);
      if (!bVar4) {
        bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
        if (bVar4) {
          pBVar5 = std::
                   unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                   ::operator->(&this->trace);
          pRVar6 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                   get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *
                       )&keyAndFlag->orderOnly);
          pTVar9 = RuleInfo::getPendingTaskInfo(ruleInfo_00);
          inputTask = std::
                      unique_ptr<llbuild::core::Task,_std::default_delete<llbuild::core::Task>_>::
                      get(&pTVar9->task);
          llbuild::core::BuildEngineTrace::ruleScanningDeferredOnTask(pBVar5,pRVar6,inputTask);
        }
        bVar4 = RuleInfo::isInProgress(ruleInfo_00);
        if (bVar4) {
          pTVar9 = RuleInfo::getPendingTaskInfo(ruleInfo_00);
          std::
          vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ::push_back(&pTVar9->deferredScanRequests,&request);
          return;
        }
        __assert_fail("inputRuleInfo.isInProgress()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                      ,0x28e,
                      "void (anonymous namespace)::BuildEngineImpl::processRuleScanRequest(RuleScanRequest)"
                     );
      }
      if ((((undefined1  [24])request._8_24_ & (undefined1  [24])0x1) == (undefined1  [24])0x0) &&
         (keyAndFlag[4].keyID._value < (ruleInfo_00->result).computedAt)) {
        bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
        if (bVar4) {
          pBVar5 = std::
                   unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
                   ::operator->(&this->trace);
          pRVar6 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                   get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *
                       )&keyAndFlag->orderOnly);
          pRVar7 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                   get(&ruleInfo_00->rule);
          llbuild::core::BuildEngineTrace::ruleNeedsToRunBecauseInputRebuilt(pBVar5,pRVar6,pRVar7);
        }
        finishScanRequest(this,(RuleInfo *)keyAndFlag,NeedsToRun);
        pBVar1 = this->delegate;
        pRVar6 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 get((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)
                     &keyAndFlag->orderOnly);
        pRVar7 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::
                 get(&ruleInfo_00->rule);
        (*pBVar1->_vptr_BuildEngineDelegate[4])(pBVar1,pRVar6,3,pRVar7);
        return;
      }
      uVar12 = request.inputIndex + 1;
      auVar3 = (undefined1  [20])request._12_20_;
      request.inputIndex = uVar12;
      auVar2 = (undefined1  [24])request._8_24_;
      request._8_24_ = CONCAT204(auVar3,request.inputIndex);
      uVar10 = request._8_8_ & 0xffffffff;
      request._8_24_ = auVar2;
      sVar11 = llbuild::core::DependencyKeyIDs::size((DependencyKeyIDs *)&keyAndFlag[4].orderOnly);
    } while (uVar10 != sVar11);
    bVar4 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->trace);
    if (bVar4) {
      pBVar5 = std::
               unique_ptr<llbuild::core::BuildEngineTrace,_std::default_delete<llbuild::core::BuildEngineTrace>_>
               ::operator->(&this->trace);
      pRVar6 = std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::get
                         ((unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>
                           *)&keyAndFlag->orderOnly);
      llbuild::core::BuildEngineTrace::ruleDoesNotNeedToRun(pBVar5,pRVar6);
    }
    finishScanRequest(this,(RuleInfo *)keyAndFlag,DoesNotNeedToRun);
  }
  return;
}

Assistant:

void processRuleScanRequest(RuleScanRequest request) {
    auto& ruleInfo = *request.ruleInfo;

    // With forced builds in cycle breaking, we may end up being asked to scan
    // something that has already been 'scanned'
    assert(ruleInfo.isScanning() || ruleInfo.wasForced);
    if (!ruleInfo.isScanning())
      return;

    // Process each of the remaining inputs.
    do {
      // Look up the input rule info, if not yet cached.
      if (!request.inputRuleInfo) {
        const auto& keyAndFlag = ruleInfo.result.dependencies[request.inputIndex];
        request.inputRuleInfo = &getRuleInfoForKey(keyAndFlag.keyID);
        request.orderOnly = keyAndFlag.orderOnly;
        request.singleUse = keyAndFlag.singleUse;
      }

      auto& inputRuleInfo = *request.inputRuleInfo;

      // Scan the input.
      bool isScanned = scanRule(inputRuleInfo);

      // If the input isn't scanned yet, enqueue this input scan request.
      if (!isScanned) {
        assert(inputRuleInfo.isScanning());
        if (trace)
          trace->ruleScanningDeferredOnInput(ruleInfo.rule.get(),
                                             inputRuleInfo.rule.get());
        inputRuleInfo.getPendingScanRecord()
          ->deferredScanRequests.push_back(request);
        return;
      }

      if (trace)
        trace->ruleScanningNextInput(ruleInfo.rule.get(), inputRuleInfo.rule.get());

      // Demand the input.
      bool isAvailable = demandRule(inputRuleInfo);

      // If the input isn't already available, enqueue this scan request on the
      // input.
      //
      // FIXME: We need to continue scanning the rest of the inputs to ensure we
      // are not delaying necessary work. See <rdar://problem/20248283>.
      if (!isAvailable) {
        if (trace)
          trace->ruleScanningDeferredOnTask(
            ruleInfo.rule.get(), inputRuleInfo.getPendingTaskInfo()->task.get());
        assert(inputRuleInfo.isInProgress());
        inputRuleInfo.getPendingTaskInfo()->
            deferredScanRequests.push_back(request);
        return;
      }

      if (request.orderOnly) {
        // If the input is an order-only input it is just enough that it
        // is available. No need to run anew.
      } else {
        // If the input has been computed since the last time this rule was
        // built, it needs to run.
        if (ruleInfo.result.builtAt < inputRuleInfo.result.computedAt) {
          if (trace)
            trace->ruleNeedsToRunBecauseInputRebuilt(
              ruleInfo.rule.get(), inputRuleInfo.rule.get());
          finishScanRequest(ruleInfo, RuleInfo::StateKind::NeedsToRun);
          delegate.determinedRuleNeedsToRun(ruleInfo.rule.get(), Rule::RunReason::InputRebuilt, inputRuleInfo.rule.get());
          return;
        }
      }

      // Otherwise, increment the scan index.
      ++request.inputIndex;
      request.inputRuleInfo = nullptr;
      request.orderOnly = false;
      request.singleUse = false;
    } while (request.inputIndex != ruleInfo.result.dependencies.size());

    // If we reached the end of the inputs, the rule does not need to run.
    if (trace)
      trace->ruleDoesNotNeedToRun(ruleInfo.rule.get());
    finishScanRequest(ruleInfo, RuleInfo::StateKind::DoesNotNeedToRun);
  }